

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNeuron.cpp
# Opt level: O0

void __thiscall
BasicNeuron::Backward
          (BasicNeuron *this,float sumOutput,float delta,size_t totalNeurons,size_t activeNeurons,
          float meanReversedSquaredThresholds)

{
  ISynapse *pIVar1;
  bool bVar2;
  reference ppIVar3;
  ulong uVar4;
  long *plVar5;
  float fVar6;
  float fVar7;
  INeuron *next;
  ISynapse *outputSynapsePtr;
  ISynapse *outputSynapse;
  iterator __end1;
  iterator __begin1;
  ISynapses *__range1;
  float meanReversedSquaredThresholds_local;
  size_t activeNeurons_local;
  size_t totalNeurons_local;
  float delta_local;
  float sumOutput_local;
  BasicNeuron *this_local;
  
  bVar2 = std::
          unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
          ::empty((unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
                   *)&this->field_0x80);
  if (bVar2) {
    this->grad = delta;
  }
  __end1 = std::
           unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
           ::begin((unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
                    *)&this->field_0x80);
  outputSynapse =
       (ISynapse *)
       std::
       unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
       ::end((unordered_set<ISynapse_*,_std::hash<ISynapse_*>,_std::equal_to<ISynapse_*>,_std::allocator<ISynapse_*>_>
              *)&this->field_0x80);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<ISynapse_*,_false>,
                            (_Node_iterator_base<ISynapse_*,_false> *)&outputSynapse), bVar2) {
    ppIVar3 = std::__detail::_Node_iterator<ISynapse_*,_true,_false>::operator*(&__end1);
    pIVar1 = *ppIVar3;
    uVar4 = ISynapse::IsUpdatable();
    if ((uVar4 & 1) != 0) {
      plVar5 = (long *)ISynapse::GetPostSynapticNeuron();
      fVar6 = (float)(**(code **)(*plVar5 + 0x48))();
      fVar7 = (float)(**(code **)(*(long *)pIVar1 + 8))();
      this->grad = fVar6 * fVar7 + this->grad;
      (**(code **)(*(long *)pIVar1 + 0x38))(*(undefined4 *)&this->field_0xbc);
    }
    std::__detail::_Node_iterator<ISynapse_*,_true,_false>::operator++(&__end1);
  }
  return;
}

Assistant:

void BasicNeuron::Backward( float sumOutput, float delta, size_t totalNeurons, size_t activeNeurons,
                            float meanReversedSquaredThresholds )
{
    if ( outputSynapses.empty()) {
        grad = delta;
    }
    for ( ISynapse *outputSynapse: outputSynapses ) {
        auto outputSynapsePtr = outputSynapse;
        if ( !( outputSynapsePtr->IsUpdatable())) {
            continue;
        }
        auto next = outputSynapsePtr->GetPostSynapticNeuron();
        grad += next->GetGrad() * outputSynapsePtr->GetStrength();
        outputSynapsePtr->Backward( potential );
    }
}